

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypes.h
# Opt level: O0

void __thiscall
Diligent::Box::Box(Box *this,Uint32 _MinX,Uint32 _MaxX,Uint32 _MinY,Uint32 _MaxY,Uint32 _MinZ,
                  Uint32 _MaxZ)

{
  Uint32 _MinZ_local;
  Uint32 _MaxY_local;
  Uint32 _MinY_local;
  Uint32 _MaxX_local;
  Uint32 _MinX_local;
  Box *this_local;
  
  this->MinX = _MinX;
  this->MaxX = _MaxX;
  this->MinY = _MinY;
  this->MaxY = _MaxY;
  this->MinZ = _MinZ;
  this->MaxZ = _MaxZ;
  return;
}

Assistant:

constexpr Box(Uint32 _MinX, Uint32 _MaxX,
                  Uint32 _MinY, Uint32 _MaxY,
                  Uint32 _MinZ, Uint32 _MaxZ) noexcept:
        MinX {_MinX},
        MaxX {_MaxX},
        MinY {_MinY},
        MaxY {_MaxY},
        MinZ {_MinZ},
        MaxZ {_MaxZ}
    {}